

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall Compiler::instructionToBinary(Compiler *this,Instruction *ins)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  Operation OVar5;
  pair<int,_int> pVar6;
  string *psVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  undefined1 auVar11 [16];
  undefined4 local_48 [2];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  OVar5 = Instruction::getOpr(ins);
  if (ITCTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001196d3:
    psVar7 = (string *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Unvalid operation type","")
    ;
    *(string **)psVar7 = psVar7 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar7,local_40,local_40 + local_38);
    *(undefined8 *)(psVar7 + 0x20) = 0;
    __cxa_throw(psVar7,&Error::typeinfo,Error::~Error);
  }
  p_Var8 = &ITCTable._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var9 = ITCTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if ((int)OVar5 <= (int)p_Var9[1]._M_color) {
      p_Var8 = p_Var9;
    }
    p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < (int)OVar5];
  } while (p_Var9 != (_Base_ptr)0x0);
  if (((_Rb_tree_header *)p_Var8 == &ITCTable._M_t._M_impl.super__Rb_tree_header) ||
     ((int)OVar5 < (int)p_Var8[1]._M_color)) goto LAB_001196d3;
  std::ostream::write((char *)this->_wtr,(long)p_Var8[1]._M_parent);
  OVar5 = Instruction::getOpr(ins);
  switch(OVar5) {
  case ipush:
    pVar6 = Instruction::getParam(ins);
    auVar11 = ZEXT716(CONCAT52(CONCAT41((int)(((uint7)CONCAT21((short)(((uint7)pVar6.first._3_1_ <<
                                                                       0x30) >> 0x28),
                                                               pVar6.first._2_1_) << 0x20) >> 0x18),
                                        pVar6.first._1_1_),(ushort)(byte)pVar6.first));
    auVar11 = pshuflw(auVar11,auVar11,0x1b);
    sVar1 = auVar11._0_2_;
    sVar2 = auVar11._2_2_;
    sVar3 = auVar11._4_2_;
    sVar4 = auVar11._6_2_;
    local_48[0] = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar11[6] - (0xff < sVar4),
                           CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar11[4] - (0xff < sVar3),
                                    CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar11[2] -
                                             (0xff < sVar2),
                                             (0 < sVar1) * (sVar1 < 0x100) * auVar11[0] -
                                             (0xff < sVar1))));
    poVar10 = this->_wtr;
    break;
  default:
    goto switchD_00119625_caseD_1;
  case loada:
    pVar6 = Instruction::getParam(ins);
    local_48[0] = CONCAT22(local_48[0]._2_2_,(ushort)pVar6.first << 8 | (ushort)pVar6.first >> 8);
    std::ostream::write((char *)this->_wtr,(long)local_48);
    pVar6 = Instruction::getParam(ins);
    auVar11 = ZEXT716(CONCAT52(CONCAT41((int)(((uint7)CONCAT21((short)(((uint7)pVar6.second._3_1_ <<
                                                                       0x30) >> 0x28),
                                                               pVar6.second._2_1_) << 0x20) >> 0x18)
                                        ,pVar6.second._1_1_),(ushort)(byte)pVar6.second));
    auVar11 = pshuflw(auVar11,auVar11,0x1b);
    sVar1 = auVar11._0_2_;
    sVar2 = auVar11._2_2_;
    sVar3 = auVar11._4_2_;
    sVar4 = auVar11._6_2_;
    local_48[0] = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar11[6] - (0xff < sVar4),
                           CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar11[4] - (0xff < sVar3),
                                    CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar11[2] -
                                             (0xff < sVar2),
                                             (0 < sVar1) * (sVar1 < 0x100) * auVar11[0] -
                                             (0xff < sVar1))));
    poVar10 = this->_wtr;
    break;
  case loadc:
  case call:
  case je:
  case jne:
  case jg:
  case jge:
  case jl:
  case jle:
  case jmp:
    pVar6 = Instruction::getParam(ins);
    local_48[0] = CONCAT22(local_48[0]._2_2_,(ushort)pVar6.first << 8 | (ushort)pVar6.first >> 8);
    poVar10 = this->_wtr;
  }
  std::ostream::write((char *)poVar10,(long)local_48);
switchD_00119625_caseD_1:
  return;
}

Assistant:

void Compiler::instructionToBinary(Instruction& ins) {
	if (auto it = ITCTable.find(ins.getOpr()); it != ITCTable.end()) {
		_wtr.write(it->second, 1);
	}
	else {
		throw Error("Unvalid operation type");
	}
	switch (ins.getOpr())
	{
	case Operation::ipush: {
		u4 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::loada: {
		u2 param1 = ins.getParam().first;
		writeNBytes(&param1, sizeof param1);
		u4 param2 = ins.getParam().second;
		writeNBytes(&param2, sizeof param2);
		break;
	}
	case Operation::loadc: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::call: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jmp: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::je: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jne: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jl: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jle: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jg: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	case Operation::jge: {
		u2 param = ins.getParam().first;
		writeNBytes(&param, sizeof param);
		break;
	}
	default:
		break;
	}
}